

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined4 uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined4 uVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar28 = uVar4 * sVar7;
  lVar27 = (uVar4 + 1) * sVar7;
  lVar26 = (uVar4 + 2) * sVar7;
  lVar25 = (uVar4 + 3) * sVar7;
  aVar1 = (space->vx).field_0;
  aVar2 = (space->vy).field_0;
  aVar3 = (space->vz).field_0;
  uVar73 = *(undefined4 *)(pcVar6 + lVar28 + 8);
  auVar29._4_4_ = uVar73;
  auVar29._0_4_ = uVar73;
  auVar29._8_4_ = uVar73;
  auVar29._12_4_ = uVar73;
  auVar29 = vmulps_avx512vl((undefined1  [16])aVar3,auVar29);
  uVar73 = *(undefined4 *)(pcVar6 + lVar28 + 4);
  auVar30._4_4_ = uVar73;
  auVar30._0_4_ = uVar73;
  auVar30._8_4_ = uVar73;
  auVar30._12_4_ = uVar73;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar2,auVar30);
  uVar73 = *(undefined4 *)(pcVar6 + lVar28);
  auVar31._4_4_ = uVar73;
  auVar31._0_4_ = uVar73;
  auVar31._8_4_ = uVar73;
  auVar31._12_4_ = uVar73;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar1,auVar31);
  fVar63 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar17 = fVar63 * *(float *)(pcVar6 + lVar28 + 0xc);
  uVar73 = *(undefined4 *)(pcVar6 + lVar27 + 8);
  auVar32._4_4_ = uVar73;
  auVar32._0_4_ = uVar73;
  auVar32._8_4_ = uVar73;
  auVar32._12_4_ = uVar73;
  auVar30 = vmulps_avx512vl((undefined1  [16])aVar3,auVar32);
  uVar73 = *(undefined4 *)(pcVar6 + lVar27 + 4);
  auVar16._4_4_ = uVar73;
  auVar16._0_4_ = uVar73;
  auVar16._8_4_ = uVar73;
  auVar16._12_4_ = uVar73;
  auVar30 = vfmadd231ps_avx512vl(auVar30,(undefined1  [16])aVar2,auVar16);
  uVar73 = *(undefined4 *)(pcVar6 + lVar27);
  auVar20._4_4_ = uVar73;
  auVar20._0_4_ = uVar73;
  auVar20._8_4_ = uVar73;
  auVar20._12_4_ = uVar73;
  auVar30 = vfmadd231ps_avx512vl(auVar30,(undefined1  [16])aVar1,auVar20);
  fVar18 = fVar63 * *(float *)(pcVar6 + lVar27 + 0xc);
  uVar73 = *(undefined4 *)(pcVar6 + lVar26 + 8);
  auVar38._4_4_ = uVar73;
  auVar38._0_4_ = uVar73;
  auVar38._8_4_ = uVar73;
  auVar38._12_4_ = uVar73;
  auVar31 = vmulps_avx512vl((undefined1  [16])aVar3,auVar38);
  uVar73 = *(undefined4 *)(pcVar6 + lVar26 + 4);
  auVar33._4_4_ = uVar73;
  auVar33._0_4_ = uVar73;
  auVar33._8_4_ = uVar73;
  auVar33._12_4_ = uVar73;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar2,auVar33);
  uVar73 = *(undefined4 *)(pcVar6 + lVar26);
  auVar34._4_4_ = uVar73;
  auVar34._0_4_ = uVar73;
  auVar34._8_4_ = uVar73;
  auVar34._12_4_ = uVar73;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar1,auVar34);
  fVar19 = fVar63 * *(float *)(pcVar6 + lVar26 + 0xc);
  uVar73 = *(undefined4 *)(pcVar6 + lVar25 + 8);
  auVar35._4_4_ = uVar73;
  auVar35._0_4_ = uVar73;
  auVar35._8_4_ = uVar73;
  auVar35._12_4_ = uVar73;
  auVar32 = vmulps_avx512vl((undefined1  [16])aVar3,auVar35);
  uVar73 = *(undefined4 *)(pcVar6 + lVar25 + 4);
  auVar36._4_4_ = uVar73;
  auVar36._0_4_ = uVar73;
  auVar36._8_4_ = uVar73;
  auVar36._12_4_ = uVar73;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar2,auVar36);
  uVar73 = *(undefined4 *)(pcVar6 + lVar25);
  auVar37._4_4_ = uVar73;
  auVar37._0_4_ = uVar73;
  auVar37._8_4_ = uVar73;
  auVar37._12_4_ = uVar73;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar1,auVar37);
  fVar63 = fVar63 * *(float *)(pcVar6 + lVar25 + 0xc);
  lVar25 = (long)(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 tessellationRate;
  uVar73 = auVar29._0_4_;
  uVar78 = auVar30._0_4_;
  if (lVar25 == 4) {
    auVar64._4_4_ = fVar19;
    auVar64._0_4_ = fVar19;
    auVar64._8_4_ = fVar19;
    auVar64._12_4_ = fVar19;
    auVar16 = vblendps_avx(auVar31,auVar64,8);
    auVar71._4_4_ = uVar73;
    auVar71._0_4_ = uVar73;
    auVar71._8_4_ = uVar73;
    auVar71._12_4_ = uVar73;
    auVar20 = vshufps_avx(auVar29,auVar29,0x55);
    auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
    auVar74._4_4_ = fVar17;
    auVar74._0_4_ = fVar17;
    auVar74._8_4_ = fVar17;
    auVar74._12_4_ = fVar17;
    auVar81._4_4_ = uVar78;
    auVar81._0_4_ = uVar78;
    auVar81._8_4_ = uVar78;
    auVar81._12_4_ = uVar78;
    auVar38 = vshufps_avx(auVar30,auVar30,0x55);
    auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
    auVar79._4_4_ = fVar18;
    auVar79._0_4_ = fVar18;
    auVar79._8_4_ = fVar18;
    auVar79._12_4_ = fVar18;
    auVar33 = vbroadcastss_avx512vl(auVar31);
    auVar34 = vshufps_avx512vl(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar35 = vbroadcastss_avx512vl(auVar32);
    auVar36 = vshufps_avx512vl(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar83._4_4_ = fVar63;
    auVar83._0_4_ = fVar63;
    auVar83._8_4_ = fVar63;
    auVar83._12_4_ = fVar63;
    auVar35 = vmulps_avx512vl(auVar35,catmullrom_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,catmullrom_basis0._3740_16_);
    auVar32 = vmulps_avx512vl(auVar32,catmullrom_basis0._3740_16_);
    auVar37 = vmulps_avx512vl(auVar83,catmullrom_basis0._3740_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._2584_16_,auVar33);
    auVar34 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._2584_16_,auVar34);
    auVar31 = vfmadd231ps_fma(auVar32,catmullrom_basis0._2584_16_,auVar31);
    auVar32 = vfmadd231ps_fma(auVar37,auVar64,catmullrom_basis0._2584_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._1428_16_,auVar81);
    auVar38 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._1428_16_,auVar38);
    auVar30 = vfmadd231ps_fma(auVar31,catmullrom_basis0._1428_16_,auVar30);
    auVar31 = vfmadd231ps_fma(auVar32,catmullrom_basis0._1428_16_,auVar79);
    auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._272_16_,auVar71);
    auVar34 = vfmadd231ps_avx512vl(auVar38,catmullrom_basis0._272_16_,auVar20);
    auVar20 = vfmadd231ps_fma(auVar30,catmullrom_basis0._272_16_,auVar29);
    auVar38 = vfmadd231ps_fma(auVar31,catmullrom_basis0._272_16_,auVar74);
    auVar35 = vshufps_avx512vl(auVar33,auVar33,0xb1);
    auVar30 = vminps_avx512vl(auVar35,auVar33);
    auVar29 = vshufpd_avx(auVar30,auVar30,1);
    auVar29 = vminps_avx(auVar29,auVar30);
    auVar36 = vshufps_avx512vl(auVar34,auVar34,0xb1);
    auVar31 = vminps_avx512vl(auVar36,auVar34);
    auVar30 = vshufpd_avx(auVar31,auVar31,1);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar29 = vinsertps_avx(auVar29,auVar30,0x1c);
    auVar32 = vshufps_avx(auVar20,auVar20,0xb1);
    auVar30 = vminps_avx(auVar32,auVar20);
    auVar31 = vshufpd_avx(auVar30,auVar30,1);
    auVar30 = vminps_avx(auVar31,auVar30);
    auVar29 = vinsertps_avx(auVar29,auVar30,0x20);
    auVar31 = vmaxps_avx512vl(auVar35,auVar33);
    auVar30 = vshufpd_avx(auVar31,auVar31,1);
    auVar30 = vmaxps_avx(auVar30,auVar31);
    auVar33 = vmaxps_avx512vl(auVar36,auVar34);
    auVar31 = vshufpd_avx(auVar33,auVar33,1);
    auVar31 = vmaxps_avx(auVar31,auVar33);
    auVar30 = vinsertps_avx(auVar30,auVar31,0x1c);
    auVar31 = vmaxps_avx(auVar32,auVar20);
    auVar32 = vshufpd_avx(auVar31,auVar31,1);
    auVar31 = vmaxps_avx(auVar32,auVar31);
    auVar30 = vinsertps_avx(auVar30,auVar31,0x20);
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar38,auVar23);
    auVar32 = vprolq_avx512vl(auVar31,0x20);
    auVar31 = vmaxps_avx(auVar32,auVar31);
    uVar73 = auVar31._0_4_;
    auVar75._4_4_ = uVar73;
    auVar75._0_4_ = uVar73;
    auVar75._8_4_ = uVar73;
    auVar75._12_4_ = uVar73;
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar31 = vmaxps_avx(auVar31,auVar75);
    auVar29 = vminps_avx(auVar29,auVar16);
    auVar30 = vmaxps_avx(auVar30,auVar16);
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar64,auVar24);
    auVar31 = vmaxps_avx(auVar31,auVar32);
    auVar29 = vsubps_avx(auVar29,auVar31);
    auVar67._0_4_ = auVar30._0_4_ + auVar31._0_4_;
    auVar67._4_4_ = auVar30._4_4_ + auVar31._4_4_;
    auVar67._8_4_ = auVar30._8_4_ + auVar31._8_4_;
    auVar67._12_4_ = auVar30._12_4_ + auVar31._12_4_;
  }
  else {
    auVar39 = vpbroadcastd_avx512vl();
    auVar70._4_4_ = uVar73;
    auVar70._0_4_ = uVar73;
    auVar70._8_4_ = uVar73;
    auVar70._12_4_ = uVar73;
    auVar70._16_4_ = uVar73;
    auVar70._20_4_ = uVar73;
    auVar70._24_4_ = uVar73;
    auVar70._28_4_ = uVar73;
    auVar59._8_4_ = 1;
    auVar59._0_8_ = 0x100000001;
    auVar59._12_4_ = 1;
    auVar59._16_4_ = 1;
    auVar59._20_4_ = 1;
    auVar59._24_4_ = 1;
    auVar59._28_4_ = 1;
    auVar61 = vpermps_avx2(auVar59,ZEXT1632(auVar29));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar41 = vpermps_avx512vl(auVar40,ZEXT1632(auVar29));
    auVar76._4_4_ = fVar17;
    auVar76._0_4_ = fVar17;
    auVar76._8_4_ = fVar17;
    auVar76._12_4_ = fVar17;
    auVar76._16_4_ = fVar17;
    auVar76._20_4_ = fVar17;
    auVar76._24_4_ = fVar17;
    auVar76._28_4_ = fVar17;
    auVar77._4_4_ = uVar78;
    auVar77._0_4_ = uVar78;
    auVar77._8_4_ = uVar78;
    auVar77._12_4_ = uVar78;
    auVar77._16_4_ = uVar78;
    auVar77._20_4_ = uVar78;
    auVar77._24_4_ = uVar78;
    auVar77._28_4_ = uVar78;
    auVar62 = vpermps_avx2(auVar59,ZEXT1632(auVar30));
    auVar42 = vpermps_avx512vl(auVar40,ZEXT1632(auVar30));
    auVar80._4_4_ = fVar18;
    auVar80._0_4_ = fVar18;
    auVar80._8_4_ = fVar18;
    auVar80._12_4_ = fVar18;
    auVar80._16_4_ = fVar18;
    auVar80._20_4_ = fVar18;
    auVar80._24_4_ = fVar18;
    auVar80._28_4_ = fVar18;
    uVar73 = auVar31._0_4_;
    auVar82._4_4_ = uVar73;
    auVar82._0_4_ = uVar73;
    auVar82._8_4_ = uVar73;
    auVar82._12_4_ = uVar73;
    auVar82._16_4_ = uVar73;
    auVar82._20_4_ = uVar73;
    auVar82._24_4_ = uVar73;
    auVar82._28_4_ = uVar73;
    auVar21 = vpermps_avx2(auVar59,ZEXT1632(auVar31));
    auVar43 = vpermps_avx512vl(auVar40,ZEXT1632(auVar31));
    auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)fVar19));
    auVar45 = vbroadcastss_avx512vl(auVar32);
    auVar46 = vpermps_avx512vl(auVar59,ZEXT1632(auVar32));
    auVar47 = vpermps_avx512vl(auVar40,ZEXT1632(auVar32));
    auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)fVar63));
    lVar26 = lVar25 * 0x44;
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar40._8_4_ = 0xff800000;
    auVar40._0_8_ = 0xff800000ff800000;
    auVar40._12_4_ = 0xff800000;
    auVar40._16_4_ = 0xff800000;
    auVar40._20_4_ = 0xff800000;
    auVar40._24_4_ = 0xff800000;
    auVar40._28_4_ = 0xff800000;
    auVar66 = ZEXT864(0);
    lVar27 = 0;
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar59 = auVar40;
    auVar60 = auVar40;
    auVar57 = auVar49;
    auVar58 = auVar49;
    for (; auVar65 = auVar66._0_32_, lVar27 <= lVar25; lVar27 = lVar27 + 8) {
      auVar51 = vpbroadcastd_avx512vl();
      auVar51 = vpord_avx512vl(auVar51,_DAT_01fb4ba0);
      uVar22 = vpcmpgtd_avx512vl(auVar51,auVar39);
      auVar51 = *(undefined1 (*) [32])(lVar26 + 0x2204c74 + lVar27 * 4);
      auVar55 = *(undefined1 (*) [32])(lVar26 + 0x22050f8 + lVar27 * 4);
      auVar52 = vmulps_avx512vl(auVar45,auVar55);
      auVar53 = vmulps_avx512vl(auVar46,auVar55);
      auVar54 = vmulps_avx512vl(auVar47,auVar55);
      auVar55 = vmulps_avx512vl(auVar48,auVar55);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar51,auVar82);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar21);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar43);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar44,auVar51);
      auVar51 = *(undefined1 (*) [32])(lVar26 + 0x22047f0 + lVar27 * 4);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar51,auVar77);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar62);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar42);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar80,auVar51);
      auVar51 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 * 4 + lVar26);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar51,auVar70);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar61);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar41);
      auVar51 = vfmadd231ps_avx512vl(auVar55,auVar76,auVar51);
      auVar55 = vminps_avx512vl(auVar57,auVar52);
      bVar8 = (byte)uVar22;
      auVar56._0_4_ = (uint)(bVar8 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar55._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar9 * auVar57._4_4_ | (uint)!bVar9 * auVar55._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar9 * auVar57._8_4_ | (uint)!bVar9 * auVar55._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar56._12_4_ = (uint)bVar9 * auVar57._12_4_ | (uint)!bVar9 * auVar55._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar56._16_4_ = (uint)bVar9 * auVar57._16_4_ | (uint)!bVar9 * auVar55._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar56._20_4_ = (uint)bVar9 * auVar57._20_4_ | (uint)!bVar9 * auVar55._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar56._24_4_ = (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * auVar55._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar56._28_4_ = (uint)bVar9 * auVar57._28_4_ | (uint)!bVar9 * auVar55._28_4_;
      auVar57 = vminps_avx512vl(auVar58,auVar53);
      auVar55._0_4_ = (uint)(bVar8 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar57._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar9 * auVar58._4_4_ | (uint)!bVar9 * auVar57._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar9 * auVar58._8_4_ | (uint)!bVar9 * auVar57._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar9 * auVar58._12_4_ | (uint)!bVar9 * auVar57._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar55._16_4_ = (uint)bVar9 * auVar58._16_4_ | (uint)!bVar9 * auVar57._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar55._20_4_ = (uint)bVar9 * auVar58._20_4_ | (uint)!bVar9 * auVar57._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar55._24_4_ = (uint)bVar9 * auVar58._24_4_ | (uint)!bVar9 * auVar57._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar55._28_4_ = (uint)bVar9 * auVar58._28_4_ | (uint)!bVar9 * auVar57._28_4_;
      auVar58 = vminps_avx512vl(auVar49,auVar54);
      auVar57._0_4_ = (uint)(bVar8 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar58._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar9 * auVar49._4_4_ | (uint)!bVar9 * auVar58._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar9 * auVar49._8_4_ | (uint)!bVar9 * auVar58._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar9 * auVar49._12_4_ | (uint)!bVar9 * auVar58._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar9 * auVar49._16_4_ | (uint)!bVar9 * auVar58._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar9 * auVar49._20_4_ | (uint)!bVar9 * auVar58._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar9 * auVar49._24_4_ | (uint)!bVar9 * auVar58._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar57._28_4_ = (uint)bVar9 * auVar49._28_4_ | (uint)!bVar9 * auVar58._28_4_;
      auVar58 = vmaxps_avx512vl(auVar59,auVar52);
      auVar49._0_4_ = (uint)(bVar8 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar58._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar9 * auVar59._4_4_ | (uint)!bVar9 * auVar58._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar9 * auVar59._8_4_ | (uint)!bVar9 * auVar58._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar9 * auVar59._12_4_ | (uint)!bVar9 * auVar58._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar49._16_4_ = (uint)bVar9 * auVar59._16_4_ | (uint)!bVar9 * auVar58._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar49._20_4_ = (uint)bVar9 * auVar59._20_4_ | (uint)!bVar9 * auVar58._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar49._24_4_ = (uint)bVar9 * auVar59._24_4_ | (uint)!bVar9 * auVar58._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar49._28_4_ = (uint)bVar9 * auVar59._28_4_ | (uint)!bVar9 * auVar58._28_4_;
      auVar59 = vmaxps_avx512vl(auVar60,auVar53);
      auVar58._0_4_ = (uint)(bVar8 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar59._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar9 * auVar60._4_4_ | (uint)!bVar9 * auVar59._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar9 * auVar60._8_4_ | (uint)!bVar9 * auVar59._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar9 * auVar60._12_4_ | (uint)!bVar9 * auVar59._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar58._16_4_ = (uint)bVar9 * auVar60._16_4_ | (uint)!bVar9 * auVar59._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar58._20_4_ = (uint)bVar9 * auVar60._20_4_ | (uint)!bVar9 * auVar59._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar58._24_4_ = (uint)bVar9 * auVar60._24_4_ | (uint)!bVar9 * auVar59._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar58._28_4_ = (uint)bVar9 * auVar60._28_4_ | (uint)!bVar9 * auVar59._28_4_;
      auVar59 = vmaxps_avx512vl(auVar40,auVar54);
      auVar60._0_4_ = (uint)(bVar8 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar59._0_4_;
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar59._4_4_;
      bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar59._8_4_;
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar59._12_4_;
      bVar9 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * auVar59._16_4_;
      bVar9 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar9 * auVar40._20_4_ | (uint)!bVar9 * auVar59._20_4_;
      bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * auVar59._24_4_;
      bVar9 = SUB81(uVar22 >> 7,0);
      auVar60._28_4_ = (uint)bVar9 * auVar40._28_4_ | (uint)!bVar9 * auVar59._28_4_;
      vandps_avx512vl(auVar51,auVar50);
      auVar40 = vmaxps_avx(auVar65,auVar60);
      bVar9 = (bool)((byte)(uVar22 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar22 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar22 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar22 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar22 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar22 >> 6) & 1);
      bVar15 = SUB81(uVar22 >> 7,0);
      auVar66 = ZEXT3264(CONCAT428((uint)bVar15 * auVar66._28_4_ | (uint)!bVar15 * auVar40._28_4_,
                                   CONCAT424((uint)bVar14 * auVar66._24_4_ |
                                             (uint)!bVar14 * auVar40._24_4_,
                                             CONCAT420((uint)bVar13 * auVar66._20_4_ |
                                                       (uint)!bVar13 * auVar40._20_4_,
                                                       CONCAT416((uint)bVar12 * auVar66._16_4_ |
                                                                 (uint)!bVar12 * auVar40._16_4_,
                                                                 CONCAT412((uint)bVar11 *
                                                                           auVar66._12_4_ |
                                                                           (uint)!bVar11 *
                                                                           auVar40._12_4_,
                                                                           CONCAT48((uint)bVar10 *
                                                                                    auVar66._8_4_ |
                                                                                    (uint)!bVar10 *
                                                                                    auVar40._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar9 * auVar66._4_4_ |
                                                  (uint)!bVar9 * auVar40._4_4_,
                                                  (uint)(bVar8 & 1) * auVar66._0_4_ |
                                                  (uint)!(bool)(bVar8 & 1) * auVar40._0_4_))))))));
      auVar40 = auVar60;
      auVar59 = auVar49;
      auVar60 = auVar58;
      auVar49 = auVar57;
      auVar57 = auVar56;
      auVar58 = auVar55;
    }
    auVar61 = vshufps_avx512vl(auVar57,auVar57,0xb1);
    auVar62 = vminps_avx512vl(auVar57,auVar61);
    auVar61 = vshufpd_avx(auVar62,auVar62,5);
    auVar61 = vminps_avx(auVar62,auVar61);
    auVar29 = vminps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar61 = vshufps_avx512vl(auVar58,auVar58,0xb1);
    auVar62 = vminps_avx512vl(auVar58,auVar61);
    auVar61 = vshufpd_avx(auVar62,auVar62,5);
    auVar61 = vminps_avx(auVar62,auVar61);
    auVar30 = vminps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar30 = vunpcklps_avx(auVar29,auVar30);
    auVar61 = vshufps_avx512vl(auVar49,auVar49,0xb1);
    auVar62 = vminps_avx512vl(auVar49,auVar61);
    auVar61 = vshufpd_avx(auVar62,auVar62,5);
    auVar61 = vminps_avx(auVar62,auVar61);
    auVar29 = vminps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar29 = vinsertps_avx(auVar30,auVar29,0x28);
    auVar61 = vshufps_avx(auVar59,auVar59,0xb1);
    auVar61 = vmaxps_avx(auVar59,auVar61);
    auVar62 = vshufpd_avx(auVar61,auVar61,5);
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar30 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar61 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar61 = vmaxps_avx(auVar60,auVar61);
    auVar62 = vshufpd_avx(auVar61,auVar61,5);
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar31 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar31 = vunpcklps_avx(auVar30,auVar31);
    auVar61 = vshufps_avx(auVar40,auVar40,0xb1);
    auVar61 = vmaxps_avx(auVar40,auVar61);
    auVar62 = vshufpd_avx(auVar61,auVar61,5);
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar30 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
    auVar30 = vinsertps_avx(auVar31,auVar30,0x28);
    auVar61 = vshufps_avx(auVar65,auVar65,0xb1);
    auVar61 = vmaxps_avx(auVar65,auVar61);
    auVar62 = vshufpd_avx(auVar61,auVar61,5);
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar31 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
    fVar63 = auVar31._0_4_;
    auVar72._4_4_ = fVar63;
    auVar72._0_4_ = fVar63;
    auVar72._8_4_ = fVar63;
    auVar72._12_4_ = fVar63;
    auVar29 = vsubps_avx(auVar29,auVar72);
    auVar67._0_4_ = auVar30._0_4_ + fVar63;
    auVar67._4_4_ = auVar30._4_4_ + fVar63;
    auVar67._8_4_ = auVar30._8_4_ + fVar63;
    auVar67._12_4_ = auVar30._12_4_ + fVar63;
  }
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  auVar30 = vandps_avx(auVar29,auVar68);
  auVar31 = vandps_avx(auVar67,auVar68);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vmovshdup_avx(auVar30);
  auVar31 = vmaxss_avx(auVar31,auVar30);
  auVar30 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vmaxss_avx(auVar30,auVar31);
  fVar63 = auVar30._0_4_ * 4.7683716e-07;
  auVar69._4_4_ = fVar63;
  auVar69._0_4_ = fVar63;
  auVar69._8_4_ = fVar63;
  auVar69._12_4_ = fVar63;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar29,auVar69);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar67._0_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar67._4_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar67._8_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar67._12_4_ + fVar63;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }